

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Col_meat.hpp
# Opt level: O3

void __thiscall
arma::Col<double>::Col<arma::fill::fill_randn>
          (Col<double> *this,uword in_n_elem,fill_class<arma::fill::fill_randn> *f)

{
  long lVar1;
  result_type_conflict rVar2;
  uint uVar3;
  double *pdVar4;
  undefined8 extraout_RAX;
  ulong uVar5;
  char (*x) [39];
  long *in_FS_OFFSET;
  normal_distribution<double> local_58;
  
  (this->super_Mat<double>).n_rows = in_n_elem;
  (this->super_Mat<double>).n_cols = 1;
  (this->super_Mat<double>).n_elem = in_n_elem;
  (this->super_Mat<double>).n_alloc = 0;
  (this->super_Mat<double>).vec_state = 1;
  (this->super_Mat<double>).mem_state = 0;
  (this->super_Mat<double>).mem = (double *)0x0;
  if (in_n_elem < 0x11) {
    uVar3 = 0;
    pdVar4 = (double *)0x0;
    if (in_n_elem != 0) {
      pdVar4 = (this->super_Mat<double>).mem_local;
    }
    (this->super_Mat<double>).mem = pdVar4;
  }
  else {
    x = (char (*) [39])((ulong)in_n_elem << 3);
    pdVar4 = (double *)lkalloc::malloc((ulong)x);
    if (pdVar4 == (double *)0x0) {
      arma_stop_bad_alloc<char[39]>(x);
      Mat<double>::~Mat(&this->super_Mat<double>);
      _Unwind_Resume(extraout_RAX);
    }
    (this->super_Mat<double>).mem = pdVar4;
    uVar3 = (this->super_Mat<double>).n_elem;
    in_n_elem = uVar3;
  }
  (this->super_Mat<double>).n_alloc = uVar3;
  local_58._M_param._M_mean._0_4_ = 0;
  local_58._M_param._M_mean._4_4_ = 0;
  local_58._M_param._M_stddev._0_4_ = 0;
  local_58._M_param._M_stddev._4_4_ = 0x3ff00000;
  local_58._M_saved = 0.0;
  local_58._M_saved_available = false;
  if ((char)in_FS_OFFSET[-1] == '\0') {
    Col<arma::fill::fill_randn>();
  }
  if (in_n_elem != 0) {
    lVar1 = *in_FS_OFFSET;
    uVar5 = 0;
    do {
      rVar2 = std::normal_distribution<double>::operator()
                        (&local_58,
                         (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                          *)(lVar1 + -0x9d0),&local_58._M_param);
      pdVar4[uVar5] = rVar2;
      uVar5 = uVar5 + 1;
    } while (in_n_elem != uVar5);
  }
  return;
}

Assistant:

inline
Col<eT>::Col(const uword in_n_elem, const fill::fill_class<fill_type>& f)
  : Mat<eT>(arma_vec_indicator(), in_n_elem, 1, 1)
  {
  arma_debug_sigprint();
  
  (*this).fill(f);
  }